

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

void __thiscall ON_Xform::PlanarProjection(ON_Xform *this,ON_Plane *plane)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double (*padVar4) [4];
  long lVar5;
  double y [3];
  double x [3];
  double p [3];
  double q [3];
  
  x[0] = (plane->xaxis).x;
  x[1] = (plane->xaxis).y;
  x[2] = (plane->xaxis).z;
  y[0] = (plane->yaxis).x;
  y[1] = (plane->yaxis).y;
  y[2] = (plane->yaxis).z;
  p[0] = (plane->origin).x;
  p[1] = (plane->origin).y;
  p[2] = (plane->origin).z;
  lVar3 = 0;
  padVar4 = (double (*) [4])this;
  do {
    dVar1 = x[lVar3];
    dVar2 = y[lVar3];
    lVar5 = 0;
    do {
      (*(double (*) [4])*padVar4)[lVar5] = x[lVar5] * dVar1 + y[lVar5] * dVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    q[lVar3] = this->m_xform[lVar3][2] * p[2] +
               this->m_xform[lVar3][0] * p[0] + this->m_xform[lVar3][1] * p[1];
    lVar3 = lVar3 + 1;
    padVar4 = padVar4 + 1;
  } while (lVar3 != 3);
  this->m_xform[3][0] = 0.0;
  this->m_xform[3][1] = 0.0;
  this->m_xform[3][2] = 0.0;
  lVar3 = 0;
  do {
    *(double *)((long)this->m_xform[0] + lVar3 * 4 + 0x18) =
         *(double *)((long)p + lVar3) - *(double *)((long)q + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  this->m_xform[3][3] = 1.0;
  return;
}

Assistant:

void ON_Xform::PlanarProjection( const ON_Plane& plane )
{
  int i, j;
  double x[3] = {plane.xaxis.x,plane.xaxis.y,plane.xaxis.z};
  double y[3] = {plane.yaxis.x,plane.yaxis.y,plane.yaxis.z};
  double p[3] = {plane.origin.x,plane.origin.y,plane.origin.z};
  double q[3];
  for ( i = 0; i < 3; i++ ) 
  {
    for ( j = 0; j < 3; j++ )
    {
      m_xform[i][j] = x[i]*x[j] + y[i]*y[j];
    }
    q[i] = m_xform[i][0]*p[0] + m_xform[i][1]*p[1] + m_xform[i][2]*p[2];
  }
  for ( i = 0; i < 3; i++ )
  {
    m_xform[3][i] = 0.0;
    m_xform[i][3] = p[i]-q[i];
  }
  m_xform[3][3] = 1.0;
}